

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::MultiReporter::benchmarkEnded
          (MultiReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
          *benchmarkStats)

{
  pointer puVar1;
  IEventListener *pIVar2;
  pointer puVar3;
  
  puVar3 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar3 == puVar1) {
      return;
    }
    pIVar2 = puVar3->m_ptr;
    if (pIVar2 == (IEventListener *)0x0) break;
    (*pIVar2->_vptr_IEventListener[10])(pIVar2,benchmarkStats);
    puVar3 = puVar3 + 1;
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                ,0x385,
                "T *Catch::Detail::unique_ptr<Catch::IEventListener>::operator->() [T = Catch::IEventListener]"
               );
}

Assistant:

IEventListenerPtr createReporter(std::string const& reporterName, ReporterConfig&& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, CATCH_MOVE(config));
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << '\'');

            return reporter;
        }